

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse41_128_8.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_striped_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  longlong lVar8;
  longlong lVar9;
  int7 iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  __m128i *palVar22;
  __m128i *palVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  __m128i *b;
  uint uVar27;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  __m128i *palVar28;
  byte bVar29;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  undefined1 auVar30 [16];
  byte bVar46;
  undefined1 auVar31 [16];
  __m128i alVar47;
  __m128i c;
  __m128i vH_00;
  __m128i vH_01;
  __m128i a;
  int32_t in_stack_fffffffffffffa98;
  int32_t in_stack_fffffffffffffaa0;
  int32_t temp;
  int32_t column_len;
  int8_t *t;
  __m128i *pv_2;
  __m128i *pv_1;
  __m128i vCompare;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  parasail_result_t *result;
  __m128i insert_mask;
  longlong lStack_4b8;
  int8_t maxp;
  __m128i vMaxHUnit;
  __m128i vMaxH;
  __m128i vBias;
  int8_t local_47a;
  int8_t score;
  int8_t bias;
  __m128i vZero;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvE;
  __m128i *pvHMax;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_408;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  char local_3c8;
  char cStack_3c7;
  char cStack_3c6;
  char cStack_3c5;
  char cStack_3c4;
  char cStack_3c3;
  char cStack_3c2;
  char cStack_3c1;
  char cStack_3c0;
  char cStack_3bf;
  char cStack_3be;
  char cStack_3bd;
  char cStack_3bc;
  char cStack_3bb;
  char cStack_3ba;
  char cStack_3b9;
  char local_3b8;
  char cStack_3b7;
  char cStack_3b6;
  char cStack_3b5;
  char cStack_3b4;
  char cStack_3b3;
  char cStack_3b2;
  char cStack_3b1;
  char cStack_3b0;
  char cStack_3af;
  char cStack_3ae;
  char cStack_3ad;
  char cStack_3ac;
  char cStack_3ab;
  char cStack_3aa;
  char cStack_3a9;
  char local_3a8;
  char cStack_3a7;
  char cStack_3a6;
  char cStack_3a5;
  char cStack_3a4;
  char cStack_3a3;
  char cStack_3a2;
  char cStack_3a1;
  char cStack_3a0;
  char cStack_39f;
  char cStack_39e;
  char cStack_39d;
  char cStack_39c;
  char cStack_39b;
  char cStack_39a;
  char cStack_399;
  char local_398;
  char cStack_397;
  char cStack_396;
  char cStack_395;
  char cStack_394;
  char cStack_393;
  char cStack_392;
  char cStack_391;
  char cStack_390;
  char cStack_38f;
  char cStack_38e;
  char cStack_38d;
  char cStack_38c;
  char cStack_38b;
  char cStack_38a;
  char cStack_389;
  undefined1 local_358 [8];
  undefined1 local_350 [24];
  undefined1 local_338 [8];
  undefined1 local_330 [88];
  undefined1 local_2d8 [8];
  undefined1 local_2d0 [200];
  char local_208;
  char cStack_207;
  char cStack_206;
  char cStack_205;
  char cStack_204;
  char cStack_203;
  char cStack_202;
  char cStack_201;
  char cStack_200;
  char cStack_1ff;
  char cStack_1fe;
  char cStack_1fd;
  char cStack_1fc;
  char cStack_1fb;
  char cStack_1fa;
  char cStack_1f9;
  char local_1e8;
  char cStack_1e7;
  char cStack_1e6;
  char cStack_1e5;
  char cStack_1e4;
  char cStack_1e3;
  char cStack_1e2;
  char cStack_1e1;
  char cStack_1e0;
  char cStack_1df;
  char cStack_1de;
  char cStack_1dd;
  char cStack_1dc;
  char cStack_1db;
  char cStack_1da;
  char cStack_1d9;
  char local_1d8;
  char cStack_1d7;
  char cStack_1d6;
  char cStack_1d5;
  char cStack_1d4;
  char cStack_1d3;
  char cStack_1d2;
  char cStack_1d1;
  char cStack_1d0;
  char cStack_1cf;
  char cStack_1ce;
  char cStack_1cd;
  char cStack_1cc;
  char cStack_1cb;
  char cStack_1ca;
  char cStack_1c9;
  char local_1b8;
  char cStack_1b7;
  char cStack_1b6;
  char cStack_1b5;
  char cStack_1b4;
  char cStack_1b3;
  char cStack_1b2;
  char cStack_1b1;
  char cStack_1b0;
  char cStack_1af;
  char cStack_1ae;
  char cStack_1ad;
  char cStack_1ac;
  char cStack_1ab;
  char cStack_1aa;
  char cStack_1a9;
  char local_1a8;
  char cStack_1a7;
  char cStack_1a6;
  char cStack_1a5;
  char cStack_1a4;
  char cStack_1a3;
  char cStack_1a2;
  char cStack_1a1;
  char cStack_1a0;
  char cStack_19f;
  char cStack_19e;
  char cStack_19d;
  char cStack_19c;
  char cStack_19b;
  char cStack_19a;
  char cStack_199;
  char local_198;
  char cStack_197;
  char cStack_196;
  char cStack_195;
  char cStack_194;
  char cStack_193;
  char cStack_192;
  char cStack_191;
  char cStack_190;
  char cStack_18f;
  char cStack_18e;
  char cStack_18d;
  char cStack_18c;
  char cStack_18b;
  char cStack_18a;
  char cStack_189;
  char local_188;
  char cStack_187;
  char cStack_186;
  char cStack_185;
  char cStack_184;
  char cStack_183;
  char cStack_182;
  char cStack_181;
  char cStack_180;
  char cStack_17f;
  char cStack_17e;
  char cStack_17d;
  char cStack_17c;
  char cStack_17b;
  char cStack_17a;
  char cStack_179;
  char local_168;
  char cStack_167;
  char cStack_166;
  char cStack_165;
  char cStack_164;
  char cStack_163;
  char cStack_162;
  char cStack_161;
  char cStack_160;
  char cStack_15f;
  char cStack_15e;
  char cStack_15d;
  char cStack_15c;
  char cStack_15b;
  char cStack_15a;
  char cStack_159;
  char local_148;
  char cStack_147;
  char cStack_146;
  char cStack_145;
  char cStack_144;
  char cStack_143;
  char cStack_142;
  char cStack_141;
  char cStack_140;
  char cStack_13f;
  char cStack_13e;
  char cStack_13d;
  char cStack_13c;
  char cStack_13b;
  char cStack_13a;
  char cStack_139;
  char local_138;
  char cStack_137;
  char cStack_136;
  char cStack_135;
  char cStack_134;
  char cStack_133;
  char cStack_132;
  char cStack_131;
  char cStack_130;
  char cStack_12f;
  char cStack_12e;
  char cStack_12d;
  char cStack_12c;
  char cStack_12b;
  char cStack_12a;
  char cStack_129;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse41_128_8","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile8).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse41_128_8",
            "profile->profile8.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse41_128_8",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_striped_profile_sse41_128_8",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse41_128_8","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_striped_profile_sse41_128_8","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_striped_profile_sse41_128_8","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_striped_profile_sse41_128_8","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    local_408 = 0;
    iVar26 = profile->s1Len;
    ppVar2 = profile->matrix;
    iVar24 = (iVar26 + 0xf) / 0x10;
    pvVar3 = (profile->profile8).score;
    i._0_1_ = (undefined1)open;
    local_350._0_3_ = CONCAT21(CONCAT11((undefined1)i,(undefined1)i),(undefined1)i);
    local_358._0_3_ = CONCAT21(CONCAT11((undefined1)i,(undefined1)i),(undefined1)i);
    uVar4 = CONCAT17((undefined1)i,
                     CONCAT16((undefined1)i,
                              CONCAT15((undefined1)i,
                                       CONCAT14((undefined1)i,
                                                CONCAT13((undefined1)i,local_358._0_3_)))));
    uVar6 = CONCAT17((undefined1)i,
                     CONCAT16((undefined1)i,
                              CONCAT15((undefined1)i,
                                       CONCAT14((undefined1)i,
                                                CONCAT13((undefined1)i,local_350._0_3_)))));
    j._0_1_ = (undefined1)gap;
    local_330._0_3_ = CONCAT21(CONCAT11((undefined1)j,(undefined1)j),(undefined1)j);
    local_338._0_3_ = CONCAT21(CONCAT11((undefined1)j,(undefined1)j),(undefined1)j);
    uVar5 = CONCAT17((undefined1)j,
                     CONCAT16((undefined1)j,
                              CONCAT15((undefined1)j,
                                       CONCAT14((undefined1)j,
                                                CONCAT13((undefined1)j,local_338._0_3_)))));
    uVar7 = CONCAT17((undefined1)j,
                     CONCAT16((undefined1)j,
                              CONCAT15((undefined1)j,
                                       CONCAT14((undefined1)j,
                                                CONCAT13((undefined1)j,local_330._0_3_)))));
    local_47a = -0x80;
    lStack_4b8 = -0x7f7f7f7f7f7f7f80;
    vMaxHUnit[0] = -0x7f7f7f7f7f7f7f80;
    iVar25 = ppVar2->max;
    profile_local = (parasail_profile_t *)parasail_result_new_table1(iVar24 * 0x10,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x10100804;
      uVar27 = *(uint *)&profile_local->field_0xc | 0x20000;
      len = (size_t)uVar27;
      *(uint *)&profile_local->field_0xc = uVar27;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar24);
      pvHMax = parasail_memalign___m128i(0x10,(long)iVar24);
      pvE = parasail_memalign___m128i(0x10,(long)iVar24);
      b = parasail_memalign___m128i(0x10,(long)iVar24);
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMax == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar47[0] = (long)iVar24;
        alVar47[1] = extraout_RDX;
        parasail_memset___m128i(pvHLoad,alVar47,len);
        c[0] = (long)iVar24;
        c[1] = extraout_RDX_00;
        palVar28 = b;
        parasail_memset___m128i(b,c,len);
        vMaxHUnit[1] = lStack_4b8;
        vMaxH[0] = vMaxHUnit[0];
        for (end_query = 0; palVar23 = pvHLoad, palVar22 = pvE, end_query < s2Len;
            end_query = end_query + 1) {
          vF[0] = 0x8080808080808080;
          vH[1] = 0x8080808080808080;
          vH_01[0] = pvHLoad[iVar24 + -1][0];
          auVar31._8_8_ = pvHLoad[iVar24 + -1][1] << 8 | vH_01[0] >> 0x38;
          auVar31._0_8_ = vH_01[0] << 8;
          auVar30._8_8_ = 0x8080808080808080;
          auVar30._0_8_ = 0x8080808080808080;
          _vP = (__m128i)pblendvb(auVar31,auVar30,ZEXT116(0xff));
          vH_01[0] = (ulong)end_query;
          iVar1 = ppVar2->mapper[(byte)s2[vH_01[0]]];
          if (local_408 == end_query + -2) {
            pvE = pvHMax;
            pvHLoad = palVar22;
          }
          else {
            pvHLoad = pvHMax;
          }
          pvHMax = palVar23;
          for (k = 0; k < iVar24; k = k + 1) {
            auVar30 = paddsb((undefined1  [16])_vP,
                             *(undefined1 (*) [16])
                              ((long)pvVar3 + (long)k * 0x10 + (long)(iVar1 * iVar24) * 0x10));
            palVar28 = b + k;
            lVar8 = (*palVar28)[0];
            lVar9 = (*palVar28)[1];
            alVar47 = *palVar28;
            local_138 = auVar30[0];
            cStack_137 = auVar30[1];
            cStack_136 = auVar30[2];
            cStack_135 = auVar30[3];
            cStack_134 = auVar30[4];
            cStack_133 = auVar30[5];
            cStack_132 = auVar30[6];
            cStack_131 = auVar30[7];
            cStack_130 = auVar30[8];
            cStack_12f = auVar30[9];
            cStack_12e = auVar30[10];
            cStack_12d = auVar30[0xb];
            cStack_12c = auVar30[0xc];
            cStack_12b = auVar30[0xd];
            cStack_12a = auVar30[0xe];
            cStack_129 = auVar30[0xf];
            local_148 = (char)lVar8;
            cStack_147 = (char)((ulong)lVar8 >> 8);
            cStack_146 = (char)((ulong)lVar8 >> 0x10);
            cStack_145 = (char)((ulong)lVar8 >> 0x18);
            cStack_144 = (char)((ulong)lVar8 >> 0x20);
            cStack_143 = (char)((ulong)lVar8 >> 0x28);
            cStack_142 = (char)((ulong)lVar8 >> 0x30);
            cStack_141 = (char)((ulong)lVar8 >> 0x38);
            cStack_140 = (char)lVar9;
            cStack_13f = (char)((ulong)lVar9 >> 8);
            cStack_13e = (char)((ulong)lVar9 >> 0x10);
            cStack_13d = (char)((ulong)lVar9 >> 0x18);
            cStack_13c = (char)((ulong)lVar9 >> 0x20);
            cStack_13b = (char)((ulong)lVar9 >> 0x28);
            cStack_13a = (char)((ulong)lVar9 >> 0x30);
            cStack_139 = (char)((ulong)lVar9 >> 0x38);
            bVar29 = (local_138 < local_148) * local_148 | (local_138 >= local_148) * local_138;
            bVar32 = (cStack_137 < cStack_147) * cStack_147 |
                     (cStack_137 >= cStack_147) * cStack_137;
            bVar33 = (cStack_136 < cStack_146) * cStack_146 |
                     (cStack_136 >= cStack_146) * cStack_136;
            bVar34 = (cStack_135 < cStack_145) * cStack_145 |
                     (cStack_135 >= cStack_145) * cStack_135;
            bVar35 = (cStack_134 < cStack_144) * cStack_144 |
                     (cStack_134 >= cStack_144) * cStack_134;
            bVar36 = (cStack_133 < cStack_143) * cStack_143 |
                     (cStack_133 >= cStack_143) * cStack_133;
            bVar37 = (cStack_132 < cStack_142) * cStack_142 |
                     (cStack_132 >= cStack_142) * cStack_132;
            bVar38 = (cStack_131 < cStack_141) * cStack_141 |
                     (cStack_131 >= cStack_141) * cStack_131;
            bVar39 = (cStack_130 < cStack_140) * cStack_140 |
                     (cStack_130 >= cStack_140) * cStack_130;
            bVar40 = (cStack_12f < cStack_13f) * cStack_13f |
                     (cStack_12f >= cStack_13f) * cStack_12f;
            bVar41 = (cStack_12e < cStack_13e) * cStack_13e |
                     (cStack_12e >= cStack_13e) * cStack_12e;
            bVar42 = (cStack_12d < cStack_13d) * cStack_13d |
                     (cStack_12d >= cStack_13d) * cStack_12d;
            bVar43 = (cStack_12c < cStack_13c) * cStack_13c |
                     (cStack_12c >= cStack_13c) * cStack_12c;
            bVar44 = (cStack_12b < cStack_13b) * cStack_13b |
                     (cStack_12b >= cStack_13b) * cStack_12b;
            bVar45 = (cStack_12a < cStack_13a) * cStack_13a |
                     (cStack_12a >= cStack_13a) * cStack_12a;
            bVar46 = (cStack_129 < cStack_139) * cStack_139 |
                     (cStack_129 >= cStack_139) * cStack_129;
            local_168 = (char)vH[1];
            cStack_167 = vH[1]._1_1_;
            cStack_166 = vH[1]._2_1_;
            cStack_165 = vH[1]._3_1_;
            cStack_164 = vH[1]._4_1_;
            cStack_163 = vH[1]._5_1_;
            cStack_162 = vH[1]._6_1_;
            cStack_161 = vH[1]._7_1_;
            cStack_160 = (char)vH[2];
            cStack_15f = vH[2]._1_1_;
            cStack_15e = vH[2]._2_1_;
            cStack_15d = vH[2]._3_1_;
            cStack_15c = vH[2]._4_1_;
            cStack_15b = vH[2]._5_1_;
            cStack_15a = vH[2]._6_1_;
            cStack_159 = vH[2]._7_1_;
            bVar29 = ((char)bVar29 < local_168) * local_168 | ((char)bVar29 >= local_168) * bVar29;
            bVar32 = ((char)bVar32 < cStack_167) * cStack_167 |
                     ((char)bVar32 >= cStack_167) * bVar32;
            bVar33 = ((char)bVar33 < cStack_166) * cStack_166 |
                     ((char)bVar33 >= cStack_166) * bVar33;
            bVar34 = ((char)bVar34 < cStack_165) * cStack_165 |
                     ((char)bVar34 >= cStack_165) * bVar34;
            bVar35 = ((char)bVar35 < cStack_164) * cStack_164 |
                     ((char)bVar35 >= cStack_164) * bVar35;
            bVar36 = ((char)bVar36 < cStack_163) * cStack_163 |
                     ((char)bVar36 >= cStack_163) * bVar36;
            bVar37 = ((char)bVar37 < cStack_162) * cStack_162 |
                     ((char)bVar37 >= cStack_162) * bVar37;
            bVar38 = ((char)bVar38 < cStack_161) * cStack_161 |
                     ((char)bVar38 >= cStack_161) * bVar38;
            bVar39 = ((char)bVar39 < cStack_160) * cStack_160 |
                     ((char)bVar39 >= cStack_160) * bVar39;
            bVar40 = ((char)bVar40 < cStack_15f) * cStack_15f |
                     ((char)bVar40 >= cStack_15f) * bVar40;
            bVar41 = ((char)bVar41 < cStack_15e) * cStack_15e |
                     ((char)bVar41 >= cStack_15e) * bVar41;
            bVar42 = ((char)bVar42 < cStack_15d) * cStack_15d |
                     ((char)bVar42 >= cStack_15d) * bVar42;
            bVar43 = ((char)bVar43 < cStack_15c) * cStack_15c |
                     ((char)bVar43 >= cStack_15c) * bVar43;
            bVar44 = ((char)bVar44 < cStack_15b) * cStack_15b |
                     ((char)bVar44 >= cStack_15b) * bVar44;
            bVar45 = ((char)bVar45 < cStack_15a) * cStack_15a |
                     ((char)bVar45 >= cStack_15a) * bVar45;
            bVar46 = ((char)bVar46 < cStack_159) * cStack_159 |
                     ((char)bVar46 >= cStack_159) * bVar46;
            vP._0_2_ = CONCAT11(bVar32,bVar29);
            vP._0_3_ = CONCAT12(bVar33,vP._0_2_);
            vP._0_4_ = CONCAT13(bVar34,vP._0_3_);
            vP._0_5_ = CONCAT14(bVar35,vP._0_4_);
            vP._0_6_ = CONCAT15(bVar36,vP._0_5_);
            vP._0_7_ = CONCAT16(bVar37,vP._0_6_);
            vP = (__m128i *)CONCAT17(bVar38,vP._0_7_);
            vH[0]._0_1_ = bVar39;
            vH[0]._1_1_ = bVar40;
            vH[0]._2_1_ = bVar41;
            vH[0]._3_1_ = bVar42;
            vH[0]._4_1_ = bVar43;
            vH[0]._5_1_ = bVar44;
            vH[0]._6_1_ = bVar45;
            vH[0]._7_1_ = bVar46;
            pvHLoad[k][0] = (longlong)vP;
            pvHLoad[k][1] = vH[0];
            palVar28 = (__m128i *)
                       ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                       rowcols->score_row;
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar24;
            vH_00[1]._4_4_ = 0;
            arr_store_si128((int *)palVar28,vH_00,end_query,s2Len,-0x80,in_stack_fffffffffffffa98,
                            in_stack_fffffffffffffaa0);
            local_188 = (char)vMaxHUnit[1];
            cStack_187 = (char)((ulong)vMaxHUnit[1] >> 8);
            cStack_186 = (char)((ulong)vMaxHUnit[1] >> 0x10);
            cStack_185 = (char)((ulong)vMaxHUnit[1] >> 0x18);
            cStack_184 = (char)((ulong)vMaxHUnit[1] >> 0x20);
            cStack_183 = (char)((ulong)vMaxHUnit[1] >> 0x28);
            cStack_182 = (char)((ulong)vMaxHUnit[1] >> 0x30);
            cStack_181 = (char)((ulong)vMaxHUnit[1] >> 0x38);
            cStack_180 = (char)vMaxH[0];
            cStack_17f = (char)((ulong)vMaxH[0] >> 8);
            cStack_17e = (char)((ulong)vMaxH[0] >> 0x10);
            cStack_17d = (char)((ulong)vMaxH[0] >> 0x18);
            cStack_17c = (char)((ulong)vMaxH[0] >> 0x20);
            cStack_17b = (char)((ulong)vMaxH[0] >> 0x28);
            cStack_17a = (char)((ulong)vMaxH[0] >> 0x30);
            cStack_179 = (char)((ulong)vMaxH[0] >> 0x38);
            vMaxHUnit[1]._0_2_ =
                 CONCAT11(((char)bVar32 < cStack_187) * cStack_187 |
                          ((char)bVar32 >= cStack_187) * bVar32,
                          ((char)bVar29 < local_188) * local_188 |
                          ((char)bVar29 >= local_188) * bVar29);
            vMaxHUnit[1]._0_3_ =
                 CONCAT12(((char)bVar33 < cStack_186) * cStack_186 |
                          ((char)bVar33 >= cStack_186) * bVar33,(undefined2)vMaxHUnit[1]);
            vMaxHUnit[1]._0_4_ =
                 CONCAT13(((char)bVar34 < cStack_185) * cStack_185 |
                          ((char)bVar34 >= cStack_185) * bVar34,(undefined3)vMaxHUnit[1]);
            vMaxHUnit[1]._0_5_ =
                 CONCAT14(((char)bVar35 < cStack_184) * cStack_184 |
                          ((char)bVar35 >= cStack_184) * bVar35,(undefined4)vMaxHUnit[1]);
            vMaxHUnit[1]._0_6_ =
                 CONCAT15(((char)bVar36 < cStack_183) * cStack_183 |
                          ((char)bVar36 >= cStack_183) * bVar36,(undefined5)vMaxHUnit[1]);
            vMaxHUnit[1]._0_7_ =
                 CONCAT16(((char)bVar37 < cStack_182) * cStack_182 |
                          ((char)bVar37 >= cStack_182) * bVar37,(undefined6)vMaxHUnit[1]);
            vMaxHUnit[1] = CONCAT17(((char)bVar38 < cStack_181) * cStack_181 |
                                    ((char)bVar38 >= cStack_181) * bVar38,(undefined7)vMaxHUnit[1]);
            vMaxH[0]._0_2_ =
                 CONCAT11(((char)bVar40 < cStack_17f) * cStack_17f |
                          ((char)bVar40 >= cStack_17f) * bVar40,
                          ((char)bVar39 < cStack_180) * cStack_180 |
                          ((char)bVar39 >= cStack_180) * bVar39);
            vMaxH[0]._0_3_ =
                 CONCAT12(((char)bVar41 < cStack_17e) * cStack_17e |
                          ((char)bVar41 >= cStack_17e) * bVar41,(undefined2)vMaxH[0]);
            vMaxH[0]._0_4_ =
                 CONCAT13(((char)bVar42 < cStack_17d) * cStack_17d |
                          ((char)bVar42 >= cStack_17d) * bVar42,(undefined3)vMaxH[0]);
            vMaxH[0]._0_5_ =
                 CONCAT14(((char)bVar43 < cStack_17c) * cStack_17c |
                          ((char)bVar43 >= cStack_17c) * bVar43,(undefined4)vMaxH[0]);
            vMaxH[0]._0_6_ =
                 CONCAT15(((char)bVar44 < cStack_17b) * cStack_17b |
                          ((char)bVar44 >= cStack_17b) * bVar44,(undefined5)vMaxH[0]);
            vMaxH[0]._0_7_ =
                 CONCAT16(((char)bVar45 < cStack_17a) * cStack_17a |
                          ((char)bVar45 >= cStack_17a) * bVar45,(undefined6)vMaxH[0]);
            vMaxH[0] = CONCAT17(((char)bVar46 < cStack_179) * cStack_179 |
                                ((char)bVar46 >= cStack_179) * bVar46,(undefined7)vMaxH[0]);
            auVar19._8_8_ = vH[0];
            auVar19._0_8_ = vP;
            auVar18._8_8_ = uVar6;
            auVar18._0_8_ = uVar4;
            auVar30 = psubsb(auVar19,auVar18);
            auVar17._8_8_ = uVar7;
            auVar17._0_8_ = uVar5;
            auVar31 = psubsb((undefined1  [16])alVar47,auVar17);
            local_198 = auVar31[0];
            cStack_197 = auVar31[1];
            cStack_196 = auVar31[2];
            cStack_195 = auVar31[3];
            cStack_194 = auVar31[4];
            cStack_193 = auVar31[5];
            cStack_192 = auVar31[6];
            cStack_191 = auVar31[7];
            cStack_190 = auVar31[8];
            cStack_18f = auVar31[9];
            cStack_18e = auVar31[10];
            cStack_18d = auVar31[0xb];
            cStack_18c = auVar31[0xc];
            cStack_18b = auVar31[0xd];
            cStack_18a = auVar31[0xe];
            cStack_189 = auVar31[0xf];
            local_1a8 = auVar30[0];
            cStack_1a7 = auVar30[1];
            cStack_1a6 = auVar30[2];
            cStack_1a5 = auVar30[3];
            cStack_1a4 = auVar30[4];
            cStack_1a3 = auVar30[5];
            cStack_1a2 = auVar30[6];
            cStack_1a1 = auVar30[7];
            cStack_1a0 = auVar30[8];
            cStack_19f = auVar30[9];
            cStack_19e = auVar30[10];
            cStack_19d = auVar30[0xb];
            cStack_19c = auVar30[0xc];
            cStack_19b = auVar30[0xd];
            cStack_19a = auVar30[0xe];
            cStack_199 = auVar30[0xf];
            vF[1] = CONCAT17((cStack_191 < cStack_1a1) * cStack_1a1 |
                             (cStack_191 >= cStack_1a1) * cStack_191,
                             CONCAT16((cStack_192 < cStack_1a2) * cStack_1a2 |
                                      (cStack_192 >= cStack_1a2) * cStack_192,
                                      CONCAT15((cStack_193 < cStack_1a3) * cStack_1a3 |
                                               (cStack_193 >= cStack_1a3) * cStack_193,
                                               CONCAT14((cStack_194 < cStack_1a4) * cStack_1a4 |
                                                        (cStack_194 >= cStack_1a4) * cStack_194,
                                                        CONCAT13((cStack_195 < cStack_1a5) *
                                                                 cStack_1a5 |
                                                                 (cStack_195 >= cStack_1a5) *
                                                                 cStack_195,
                                                                 CONCAT12((cStack_196 < cStack_1a6)
                                                                          * cStack_1a6 |
                                                                          (cStack_196 >= cStack_1a6)
                                                                          * cStack_196,
                                                                          CONCAT11((cStack_197 <
                                                                                   cStack_1a7) *
                                                                                   cStack_1a7 |
                                                                                   (cStack_197 >=
                                                                                   cStack_1a7) *
                                                                                   cStack_197,
                                                                                   (local_198 <
                                                                                   local_1a8) *
                                                                                   local_1a8 |
                                                                                   (local_198 >=
                                                                                   local_1a8) *
                                                                                   local_198)))))));
            vE[0]._0_1_ = (cStack_190 < cStack_1a0) * cStack_1a0 |
                          (cStack_190 >= cStack_1a0) * cStack_190;
            vE[0]._1_1_ = (cStack_18f < cStack_19f) * cStack_19f |
                          (cStack_18f >= cStack_19f) * cStack_18f;
            vE[0]._2_1_ = (cStack_18e < cStack_19e) * cStack_19e |
                          (cStack_18e >= cStack_19e) * cStack_18e;
            vE[0]._3_1_ = (cStack_18d < cStack_19d) * cStack_19d |
                          (cStack_18d >= cStack_19d) * cStack_18d;
            vE[0]._4_1_ = (cStack_18c < cStack_19c) * cStack_19c |
                          (cStack_18c >= cStack_19c) * cStack_18c;
            vE[0]._5_1_ = (cStack_18b < cStack_19b) * cStack_19b |
                          (cStack_18b >= cStack_19b) * cStack_18b;
            vE[0]._6_1_ = (cStack_18a < cStack_19a) * cStack_19a |
                          (cStack_18a >= cStack_19a) * cStack_18a;
            vE[0]._7_1_ = (cStack_189 < cStack_199) * cStack_199 |
                          (cStack_189 >= cStack_199) * cStack_189;
            b[k][0] = vF[1];
            b[k][1] = vE[0];
            auVar16._8_8_ = uVar7;
            auVar16._0_8_ = uVar5;
            auVar30 = psubsb(stack0xfffffffffffffaf8,auVar16);
            local_1b8 = auVar30[0];
            cStack_1b7 = auVar30[1];
            cStack_1b6 = auVar30[2];
            cStack_1b5 = auVar30[3];
            cStack_1b4 = auVar30[4];
            cStack_1b3 = auVar30[5];
            cStack_1b2 = auVar30[6];
            cStack_1b1 = auVar30[7];
            cStack_1b0 = auVar30[8];
            cStack_1af = auVar30[9];
            cStack_1ae = auVar30[10];
            cStack_1ad = auVar30[0xb];
            cStack_1ac = auVar30[0xc];
            cStack_1ab = auVar30[0xd];
            cStack_1aa = auVar30[0xe];
            cStack_1a9 = auVar30[0xf];
            vH[1] = CONCAT17((cStack_1b1 < cStack_1a1) * cStack_1a1 |
                             (cStack_1b1 >= cStack_1a1) * cStack_1b1,
                             CONCAT16((cStack_1b2 < cStack_1a2) * cStack_1a2 |
                                      (cStack_1b2 >= cStack_1a2) * cStack_1b2,
                                      CONCAT15((cStack_1b3 < cStack_1a3) * cStack_1a3 |
                                               (cStack_1b3 >= cStack_1a3) * cStack_1b3,
                                               CONCAT14((cStack_1b4 < cStack_1a4) * cStack_1a4 |
                                                        (cStack_1b4 >= cStack_1a4) * cStack_1b4,
                                                        CONCAT13((cStack_1b5 < cStack_1a5) *
                                                                 cStack_1a5 |
                                                                 (cStack_1b5 >= cStack_1a5) *
                                                                 cStack_1b5,
                                                                 CONCAT12((cStack_1b6 < cStack_1a6)
                                                                          * cStack_1a6 |
                                                                          (cStack_1b6 >= cStack_1a6)
                                                                          * cStack_1b6,
                                                                          CONCAT11((cStack_1b7 <
                                                                                   cStack_1a7) *
                                                                                   cStack_1a7 |
                                                                                   (cStack_1b7 >=
                                                                                   cStack_1a7) *
                                                                                   cStack_1b7,
                                                                                   (local_1b8 <
                                                                                   local_1a8) *
                                                                                   local_1a8 |
                                                                                   (local_1b8 >=
                                                                                   local_1a8) *
                                                                                   local_1b8)))))));
            vF[0]._0_1_ = (cStack_1b0 < cStack_1a0) * cStack_1a0 |
                          (cStack_1b0 >= cStack_1a0) * cStack_1b0;
            vF[0]._1_1_ = (cStack_1af < cStack_19f) * cStack_19f |
                          (cStack_1af >= cStack_19f) * cStack_1af;
            vF[0]._2_1_ = (cStack_1ae < cStack_19e) * cStack_19e |
                          (cStack_1ae >= cStack_19e) * cStack_1ae;
            vF[0]._3_1_ = (cStack_1ad < cStack_19d) * cStack_19d |
                          (cStack_1ad >= cStack_19d) * cStack_1ad;
            vF[0]._4_1_ = (cStack_1ac < cStack_19c) * cStack_19c |
                          (cStack_1ac >= cStack_19c) * cStack_1ac;
            vF[0]._5_1_ = (cStack_1ab < cStack_19b) * cStack_19b |
                          (cStack_1ab >= cStack_19b) * cStack_1ab;
            vF[0]._6_1_ = (cStack_1aa < cStack_19a) * cStack_19a |
                          (cStack_1aa >= cStack_19a) * cStack_1aa;
            vF[0]._7_1_ = (cStack_1a9 < cStack_199) * cStack_199 |
                          (cStack_1a9 >= cStack_199) * cStack_1a9;
            _vP = palVar23[k];
            vH_01[0] = vH_00[0];
          }
          for (end_ref = 0; end_ref < 0x10; end_ref = end_ref + 1) {
            auVar12._8_8_ = vF[0] << 8 | (ulong)vH[1] >> 0x38;
            auVar12._0_8_ = vH[1] << 8;
            auVar11._8_8_ = 0x8080808080808080;
            auVar11._0_8_ = 0x8080808080808080;
            register0x00001240 = pblendvb(auVar12,auVar11,ZEXT816(0xff));
            for (k = 0; k < iVar24; k = k + 1) {
              lVar8 = pvHLoad[k][0];
              lVar9 = pvHLoad[k][1];
              local_1d8 = (char)lVar8;
              cStack_1d7 = (char)((ulong)lVar8 >> 8);
              cStack_1d6 = (char)((ulong)lVar8 >> 0x10);
              cStack_1d5 = (char)((ulong)lVar8 >> 0x18);
              cStack_1d4 = (char)((ulong)lVar8 >> 0x20);
              cStack_1d3 = (char)((ulong)lVar8 >> 0x28);
              cStack_1d2 = (char)((ulong)lVar8 >> 0x30);
              cStack_1d1 = (char)((ulong)lVar8 >> 0x38);
              cStack_1d0 = (char)lVar9;
              cStack_1cf = (char)((ulong)lVar9 >> 8);
              cStack_1ce = (char)((ulong)lVar9 >> 0x10);
              cStack_1cd = (char)((ulong)lVar9 >> 0x18);
              cStack_1cc = (char)((ulong)lVar9 >> 0x20);
              cStack_1cb = (char)((ulong)lVar9 >> 0x28);
              cStack_1ca = (char)((ulong)lVar9 >> 0x30);
              cStack_1c9 = (char)((ulong)lVar9 >> 0x38);
              local_1e8 = (char)vH[1];
              cStack_1e7 = vH[1]._1_1_;
              cStack_1e6 = vH[1]._2_1_;
              cStack_1e5 = vH[1]._3_1_;
              cStack_1e4 = vH[1]._4_1_;
              cStack_1e3 = vH[1]._5_1_;
              cStack_1e2 = vH[1]._6_1_;
              cStack_1e1 = vH[1]._7_1_;
              cStack_1e0 = (char)vH[2];
              cStack_1df = vH[2]._1_1_;
              cStack_1de = vH[2]._2_1_;
              cStack_1dd = vH[2]._3_1_;
              cStack_1dc = vH[2]._4_1_;
              cStack_1db = vH[2]._5_1_;
              cStack_1da = vH[2]._6_1_;
              cStack_1d9 = vH[2]._7_1_;
              bVar29 = (local_1d8 < local_1e8) * local_1e8 | (local_1d8 >= local_1e8) * local_1d8;
              bVar32 = (cStack_1d7 < cStack_1e7) * cStack_1e7 |
                       (cStack_1d7 >= cStack_1e7) * cStack_1d7;
              bVar33 = (cStack_1d6 < cStack_1e6) * cStack_1e6 |
                       (cStack_1d6 >= cStack_1e6) * cStack_1d6;
              bVar34 = (cStack_1d5 < cStack_1e5) * cStack_1e5 |
                       (cStack_1d5 >= cStack_1e5) * cStack_1d5;
              bVar35 = (cStack_1d4 < cStack_1e4) * cStack_1e4 |
                       (cStack_1d4 >= cStack_1e4) * cStack_1d4;
              bVar36 = (cStack_1d3 < cStack_1e3) * cStack_1e3 |
                       (cStack_1d3 >= cStack_1e3) * cStack_1d3;
              bVar37 = (cStack_1d2 < cStack_1e2) * cStack_1e2 |
                       (cStack_1d2 >= cStack_1e2) * cStack_1d2;
              bVar38 = (cStack_1d1 < cStack_1e1) * cStack_1e1 |
                       (cStack_1d1 >= cStack_1e1) * cStack_1d1;
              bVar39 = (cStack_1d0 < cStack_1e0) * cStack_1e0 |
                       (cStack_1d0 >= cStack_1e0) * cStack_1d0;
              bVar40 = (cStack_1cf < cStack_1df) * cStack_1df |
                       (cStack_1cf >= cStack_1df) * cStack_1cf;
              bVar41 = (cStack_1ce < cStack_1de) * cStack_1de |
                       (cStack_1ce >= cStack_1de) * cStack_1ce;
              bVar42 = (cStack_1cd < cStack_1dd) * cStack_1dd |
                       (cStack_1cd >= cStack_1dd) * cStack_1cd;
              bVar43 = (cStack_1cc < cStack_1dc) * cStack_1dc |
                       (cStack_1cc >= cStack_1dc) * cStack_1cc;
              bVar44 = (cStack_1cb < cStack_1db) * cStack_1db |
                       (cStack_1cb >= cStack_1db) * cStack_1cb;
              bVar45 = (cStack_1ca < cStack_1da) * cStack_1da |
                       (cStack_1ca >= cStack_1da) * cStack_1ca;
              bVar46 = (cStack_1c9 < cStack_1d9) * cStack_1d9 |
                       (cStack_1c9 >= cStack_1d9) * cStack_1c9;
              vP._0_2_ = CONCAT11(bVar32,bVar29);
              vP._0_3_ = CONCAT12(bVar33,vP._0_2_);
              vP._0_4_ = CONCAT13(bVar34,vP._0_3_);
              vP._0_5_ = CONCAT14(bVar35,vP._0_4_);
              vP._0_6_ = CONCAT15(bVar36,vP._0_5_);
              vP._0_7_ = CONCAT16(bVar37,vP._0_6_);
              vP = (__m128i *)CONCAT17(bVar38,vP._0_7_);
              vH[0]._0_1_ = bVar39;
              vH[0]._1_1_ = bVar40;
              vH[0]._2_1_ = bVar41;
              vH[0]._3_1_ = bVar42;
              vH[0]._4_1_ = bVar43;
              vH[0]._5_1_ = bVar44;
              vH[0]._6_1_ = bVar45;
              vH[0]._7_1_ = bVar46;
              pvHLoad[k][0] = (longlong)vP;
              pvHLoad[k][1] = vH[0];
              palVar28 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_01[0] = (ulong)(uint)k;
              vH_01[1]._0_4_ = iVar24;
              vH_01[1]._4_4_ = 0;
              arr_store_si128((int *)palVar28,vH_01,end_query,s2Len,-0x80,in_stack_fffffffffffffa98,
                              in_stack_fffffffffffffaa0);
              local_208 = (char)vMaxHUnit[1];
              cStack_207 = (char)((ulong)vMaxHUnit[1] >> 8);
              cStack_206 = (char)((ulong)vMaxHUnit[1] >> 0x10);
              cStack_205 = (char)((ulong)vMaxHUnit[1] >> 0x18);
              cStack_204 = (char)((ulong)vMaxHUnit[1] >> 0x20);
              cStack_203 = (char)((ulong)vMaxHUnit[1] >> 0x28);
              cStack_202 = (char)((ulong)vMaxHUnit[1] >> 0x30);
              cStack_201 = (char)((ulong)vMaxHUnit[1] >> 0x38);
              cStack_200 = (char)vMaxH[0];
              cStack_1ff = (char)((ulong)vMaxH[0] >> 8);
              cStack_1fe = (char)((ulong)vMaxH[0] >> 0x10);
              cStack_1fd = (char)((ulong)vMaxH[0] >> 0x18);
              cStack_1fc = (char)((ulong)vMaxH[0] >> 0x20);
              cStack_1fb = (char)((ulong)vMaxH[0] >> 0x28);
              cStack_1fa = (char)((ulong)vMaxH[0] >> 0x30);
              cStack_1f9 = (char)((ulong)vMaxH[0] >> 0x38);
              vMaxHUnit[1]._0_2_ =
                   CONCAT11(((char)bVar32 < cStack_207) * cStack_207 |
                            ((char)bVar32 >= cStack_207) * bVar32,
                            ((char)bVar29 < local_208) * local_208 |
                            ((char)bVar29 >= local_208) * bVar29);
              vMaxHUnit[1]._0_3_ =
                   CONCAT12(((char)bVar33 < cStack_206) * cStack_206 |
                            ((char)bVar33 >= cStack_206) * bVar33,(undefined2)vMaxHUnit[1]);
              vMaxHUnit[1]._0_4_ =
                   CONCAT13(((char)bVar34 < cStack_205) * cStack_205 |
                            ((char)bVar34 >= cStack_205) * bVar34,(undefined3)vMaxHUnit[1]);
              vMaxHUnit[1]._0_5_ =
                   CONCAT14(((char)bVar35 < cStack_204) * cStack_204 |
                            ((char)bVar35 >= cStack_204) * bVar35,(undefined4)vMaxHUnit[1]);
              vMaxHUnit[1]._0_6_ =
                   CONCAT15(((char)bVar36 < cStack_203) * cStack_203 |
                            ((char)bVar36 >= cStack_203) * bVar36,(undefined5)vMaxHUnit[1]);
              vMaxHUnit[1]._0_7_ =
                   CONCAT16(((char)bVar37 < cStack_202) * cStack_202 |
                            ((char)bVar37 >= cStack_202) * bVar37,(undefined6)vMaxHUnit[1]);
              vMaxHUnit[1] = CONCAT17(((char)bVar38 < cStack_201) * cStack_201 |
                                      ((char)bVar38 >= cStack_201) * bVar38,(undefined7)vMaxHUnit[1]
                                     );
              vMaxH[0]._0_2_ =
                   CONCAT11(((char)bVar40 < cStack_1ff) * cStack_1ff |
                            ((char)bVar40 >= cStack_1ff) * bVar40,
                            ((char)bVar39 < cStack_200) * cStack_200 |
                            ((char)bVar39 >= cStack_200) * bVar39);
              vMaxH[0]._0_3_ =
                   CONCAT12(((char)bVar41 < cStack_1fe) * cStack_1fe |
                            ((char)bVar41 >= cStack_1fe) * bVar41,(undefined2)vMaxH[0]);
              vMaxH[0]._0_4_ =
                   CONCAT13(((char)bVar42 < cStack_1fd) * cStack_1fd |
                            ((char)bVar42 >= cStack_1fd) * bVar42,(undefined3)vMaxH[0]);
              vMaxH[0]._0_5_ =
                   CONCAT14(((char)bVar43 < cStack_1fc) * cStack_1fc |
                            ((char)bVar43 >= cStack_1fc) * bVar43,(undefined4)vMaxH[0]);
              vMaxH[0]._0_6_ =
                   CONCAT15(((char)bVar44 < cStack_1fb) * cStack_1fb |
                            ((char)bVar44 >= cStack_1fb) * bVar44,(undefined5)vMaxH[0]);
              vMaxH[0]._0_7_ =
                   CONCAT16(((char)bVar45 < cStack_1fa) * cStack_1fa |
                            ((char)bVar45 >= cStack_1fa) * bVar45,(undefined6)vMaxH[0]);
              vMaxH[0] = CONCAT17(((char)bVar46 < cStack_1f9) * cStack_1f9 |
                                  ((char)bVar46 >= cStack_1f9) * bVar46,(undefined7)vMaxH[0]);
              auVar15._8_8_ = vH[0];
              auVar15._0_8_ = vP;
              auVar14._8_8_ = uVar6;
              auVar14._0_8_ = uVar4;
              auVar30 = psubsb(auVar15,auVar14);
              auVar13._8_8_ = uVar7;
              auVar13._0_8_ = uVar5;
              register0x00001200 = psubsb(stack0xfffffffffffffaf8,auVar13);
              local_398 = (char)vH[1];
              cStack_397 = vH[1]._1_1_;
              cStack_396 = vH[1]._2_1_;
              cStack_395 = vH[1]._3_1_;
              cStack_394 = vH[1]._4_1_;
              cStack_393 = vH[1]._5_1_;
              cStack_392 = vH[1]._6_1_;
              cStack_391 = vH[1]._7_1_;
              cStack_390 = (char)vH[2];
              cStack_38f = vH[2]._1_1_;
              cStack_38e = vH[2]._2_1_;
              cStack_38d = vH[2]._3_1_;
              cStack_38c = vH[2]._4_1_;
              cStack_38b = vH[2]._5_1_;
              cStack_38a = vH[2]._6_1_;
              cStack_389 = vH[2]._7_1_;
              local_3a8 = auVar30[0];
              cStack_3a7 = auVar30[1];
              cStack_3a6 = auVar30[2];
              cStack_3a5 = auVar30[3];
              cStack_3a4 = auVar30[4];
              cStack_3a3 = auVar30[5];
              cStack_3a2 = auVar30[6];
              cStack_3a1 = auVar30[7];
              cStack_3a0 = auVar30[8];
              cStack_39f = auVar30[9];
              cStack_39e = auVar30[10];
              cStack_39d = auVar30[0xb];
              cStack_39c = auVar30[0xc];
              cStack_39b = auVar30[0xd];
              cStack_39a = auVar30[0xe];
              cStack_399 = auVar30[0xf];
              auVar21[1] = -(cStack_3a7 < cStack_397);
              auVar21[0] = -(local_3a8 < local_398);
              auVar21[2] = -(cStack_3a6 < cStack_396);
              auVar21[3] = -(cStack_3a5 < cStack_395);
              auVar21[4] = -(cStack_3a4 < cStack_394);
              auVar21[5] = -(cStack_3a3 < cStack_393);
              auVar21[6] = -(cStack_3a2 < cStack_392);
              auVar21[7] = -(cStack_3a1 < cStack_391);
              auVar21[8] = -(cStack_3a0 < cStack_390);
              auVar21[9] = -(cStack_39f < cStack_38f);
              auVar21[10] = -(cStack_39e < cStack_38e);
              auVar21[0xb] = -(cStack_39d < cStack_38d);
              auVar21[0xc] = -(cStack_39c < cStack_38c);
              auVar21[0xd] = -(cStack_39b < cStack_38b);
              auVar21[0xe] = -(cStack_39a < cStack_38a);
              auVar21[0xf] = -(cStack_399 < cStack_389);
              if ((((((((((((((((auVar21 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar21 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar21 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar21 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar21 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar21 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar21 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar21 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar21 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar21 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar21 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar21 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar21 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar21 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar21 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  cStack_399 >= cStack_389) goto LAB_009a120a;
            }
          }
LAB_009a120a:
          local_3b8 = (char)vMaxHUnit[1];
          cStack_3b7 = (char)((ulong)vMaxHUnit[1] >> 8);
          cStack_3b6 = (char)((ulong)vMaxHUnit[1] >> 0x10);
          cStack_3b5 = (char)((ulong)vMaxHUnit[1] >> 0x18);
          cStack_3b4 = (char)((ulong)vMaxHUnit[1] >> 0x20);
          cStack_3b3 = (char)((ulong)vMaxHUnit[1] >> 0x28);
          cStack_3b2 = (char)((ulong)vMaxHUnit[1] >> 0x30);
          cStack_3b1 = (char)((ulong)vMaxHUnit[1] >> 0x38);
          cStack_3b0 = (char)vMaxH[0];
          cStack_3af = (char)((ulong)vMaxH[0] >> 8);
          cStack_3ae = (char)((ulong)vMaxH[0] >> 0x10);
          cStack_3ad = (char)((ulong)vMaxH[0] >> 0x18);
          cStack_3ac = (char)((ulong)vMaxH[0] >> 0x20);
          cStack_3ab = (char)((ulong)vMaxH[0] >> 0x28);
          cStack_3aa = (char)((ulong)vMaxH[0] >> 0x30);
          cStack_3a9 = (char)((ulong)vMaxH[0] >> 0x38);
          local_3c8 = (char)lStack_4b8;
          cStack_3c7 = (char)((ulong)lStack_4b8 >> 8);
          cStack_3c6 = (char)((ulong)lStack_4b8 >> 0x10);
          cStack_3c5 = (char)((ulong)lStack_4b8 >> 0x18);
          cStack_3c4 = (char)((ulong)lStack_4b8 >> 0x20);
          cStack_3c3 = (char)((ulong)lStack_4b8 >> 0x28);
          cStack_3c2 = (char)((ulong)lStack_4b8 >> 0x30);
          cStack_3c1 = (char)((ulong)lStack_4b8 >> 0x38);
          cStack_3c0 = (char)vMaxHUnit[0];
          cStack_3bf = (char)((ulong)vMaxHUnit[0] >> 8);
          cStack_3be = (char)((ulong)vMaxHUnit[0] >> 0x10);
          cStack_3bd = (char)((ulong)vMaxHUnit[0] >> 0x18);
          cStack_3bc = (char)((ulong)vMaxHUnit[0] >> 0x20);
          cStack_3bb = (char)((ulong)vMaxHUnit[0] >> 0x28);
          cStack_3ba = (char)((ulong)vMaxHUnit[0] >> 0x30);
          cStack_3b9 = (char)((ulong)vMaxHUnit[0] >> 0x38);
          auVar20[1] = -(cStack_3c7 < cStack_3b7);
          auVar20[0] = -(local_3c8 < local_3b8);
          auVar20[2] = -(cStack_3c6 < cStack_3b6);
          auVar20[3] = -(cStack_3c5 < cStack_3b5);
          auVar20[4] = -(cStack_3c4 < cStack_3b4);
          auVar20[5] = -(cStack_3c3 < cStack_3b3);
          auVar20[6] = -(cStack_3c2 < cStack_3b2);
          auVar20[7] = -(cStack_3c1 < cStack_3b1);
          iVar10 = CONCAT16(-(cStack_3ba < cStack_3aa),
                            CONCAT15(-(cStack_3bb < cStack_3ab),
                                     CONCAT14(-(cStack_3bc < cStack_3ac),
                                              CONCAT13(-(cStack_3bd < cStack_3ad),
                                                       CONCAT12(-(cStack_3be < cStack_3ae),
                                                                CONCAT11(-(cStack_3bf < cStack_3af),
                                                                         -(cStack_3c0 < cStack_3b0))
                                                               )))));
          auVar20[0xf] = -(cStack_3b9 < cStack_3a9);
          auVar20._8_7_ = iVar10;
          if ((((((((((((((((auVar20 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar20 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar20 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar20 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar20 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar20 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (-(cStack_3c0 < cStack_3b0) & 0x80U) != 0) ||
                   (-(cStack_3bf < cStack_3af) & 0x80U) != 0) ||
                  (-(cStack_3be < cStack_3ae) & 0x80U) != 0) ||
                 (-(cStack_3bd < cStack_3ad) & 0x80U) != 0) ||
                (-(cStack_3bc < cStack_3ac) & 0x80U) != 0) ||
               (-(cStack_3bb < cStack_3ab) & 0x80U) != 0) || iVar10 != 0) || cStack_3b9 < cStack_3a9
             ) {
            a[1] = vH_01[0];
            a[0] = (longlong)palVar28;
            local_47a = _mm_hmax_epi8_rpl(a);
            if ((char)((char)iVar25 + 1U ^ 0x7f) < local_47a) {
              *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
              break;
            }
            in_stack_fffffffffffffaa0 = CONCAT13(local_47a,(int3)in_stack_fffffffffffffaa0);
            local_2d0._0_3_ = CONCAT21(CONCAT11(local_47a,local_47a),local_47a);
            local_2d8._0_3_ = CONCAT21(CONCAT11(local_47a,local_47a),local_47a);
            lStack_4b8 = CONCAT17(local_47a,
                                  CONCAT16(local_47a,
                                           CONCAT15(local_47a,
                                                    CONCAT14(local_47a,
                                                             CONCAT13(local_47a,local_2d8._0_3_)))))
            ;
            vMaxHUnit[0] = CONCAT17(local_47a,
                                    CONCAT16(local_47a,
                                             CONCAT15(local_47a,
                                                      CONCAT14(local_47a,
                                                               CONCAT13(local_47a,local_2d0._0_3_)))
                                            ));
            local_408 = end_query;
          }
        }
        palVar28 = pvE;
        if (local_47a == '\x7f') {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
        }
        iVar25 = parasail_result_is_saturated((parasail_result_t *)profile_local);
        if (iVar25 == 0) {
          if (local_408 == end_query + -1) {
            pvE = pvHLoad;
            pvHLoad = palVar28;
          }
          else if (local_408 == end_query + -2) {
            pvE = pvHMax;
            pvHMax = palVar28;
          }
          _temp = pvE;
          s1Len = iVar26 + -1;
          for (k = 0; k < iVar24 * 0x10; k = k + 1) {
            if (((char)(*_temp)[0] == local_47a) &&
               (iVar26 = k / 0x10 + (k % 0x10) * iVar24, iVar26 < s1Len)) {
              s1Len = iVar26;
            }
            _temp = (__m128i *)((long)*_temp + 1);
          }
        }
        else {
          local_47a = '\x7f';
          s1Len = 0;
          local_408 = 0;
        }
        *(int *)&profile_local->s1 = local_47a + 0x80;
        *(int32_t *)((long)&profile_local->s1 + 4) = s1Len;
        profile_local->s1Len = local_408;
        parasail_free(b);
        parasail_free(pvE);
        parasail_free(pvHMax);
        parasail_free(pvHLoad);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int8_t bias = 0;
    int8_t score = 0;
    __m128i vBias;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int8_t maxp = 0;
    __m128i insert_mask;
    /*int8_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    vZero = _mm_set1_epi8(0);
    bias = INT8_MIN;
    score = bias;
    vBias = _mm_set1_epi8(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT8_MAX - (int8_t)(matrix->max+1);
    insert_mask = _mm_cmpgt_epi8(
            _mm_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT8_MAX : (int8_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vBias, segLen);
    parasail_memset___m128i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm_slli_si128(pvHStore[segLen - 1], 1);
        vH = _mm_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8(vH, vE);
            vH = _mm_max_epi8(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm_max_epi8(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm_max_epi8(vH, vMaxH);
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15) - bias;
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi8(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT8_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}